

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_property.c
# Opt level: O0

int mpt_world_set(mpt_world *wld,char *name,mpt_convertable *src)

{
  int iVar1;
  int local_74;
  mpt_world *local_70;
  mpt_world *local_60;
  mpt_world *pmStack_48;
  int type_1;
  mpt_world *from_1;
  mpt_world *pmStack_38;
  int type;
  mpt_world *from;
  mpt_convertable *pmStack_28;
  int len;
  mpt_convertable *src_local;
  char *name_local;
  mpt_world *wld_local;
  
  pmStack_28 = src;
  src_local = (mpt_convertable *)name;
  name_local = (char *)wld;
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      wld_local._4_4_ = -4;
    }
    else {
      from_1._4_4_ = mpt_world_pointer_typeid();
      if ((from_1._4_4_ < 1) ||
         (from._4_4_ = (*pmStack_28->_vptr->convert)
                                 (pmStack_28,(long)from_1._4_4_,&stack0xffffffffffffffc8),
         from._4_4_ < 0)) {
        from._4_4_ = mpt_string_pset((char **)name_local,pmStack_28);
        wld_local._4_4_ = from._4_4_;
        if (from._4_4_ < 0) {
          from_1._4_4_ = mpt_color_typeid();
          if ((from_1._4_4_ < 1) ||
             (from._4_4_ = (*pmStack_28->_vptr->convert)
                                     (pmStack_28,(long)from_1._4_4_,name_local + 8), from._4_4_ < 0)
             ) {
            from_1._4_4_ = mpt_lattr_typeid();
            if ((from_1._4_4_ < 1) ||
               (iVar1 = (*pmStack_28->_vptr->convert)
                                  (pmStack_28,(long)from_1._4_4_,name_local + 0xc), iVar1 < 0)) {
              wld_local._4_4_ = -3;
            }
            else {
              if (iVar1 == 0) {
                name_local[0xc] = '\x01';
                name_local[0xd] = '\x01';
                name_local[0xe] = '\0';
                name_local[0xf] = '\n';
              }
              wld_local._4_4_ = 0;
            }
          }
          else {
            if (from._4_4_ == 0) {
              name_local[8] = -1;
              name_local[9] = '\0';
              name_local[10] = '\0';
              name_local[0xb] = '\0';
            }
            wld_local._4_4_ = 0;
          }
        }
      }
      else {
        mpt_world_fini((mpt_world *)name_local);
        if (from._4_4_ == 0) {
          local_60 = (mpt_world *)0x0;
        }
        else {
          local_60 = pmStack_38;
        }
        mpt_world_init((mpt_world *)name_local,local_60);
        wld_local._4_4_ = 0;
      }
    }
  }
  else if (*name == '\0') {
    if (src == (mpt_convertable *)0x0) {
      mpt_world_fini(wld);
      wld_local._4_4_ = 0;
    }
    else {
      iVar1 = mpt_world_pointer_typeid();
      if ((iVar1 < 1) ||
         (from._4_4_ = (*pmStack_28->_vptr->convert)
                                 (pmStack_28,(long)iVar1,&stack0xffffffffffffffb8), from._4_4_ < 0))
      {
        wld_local._4_4_ = -3;
      }
      else {
        mpt_world_fini((mpt_world *)name_local);
        if (from._4_4_ == 0) {
          local_70 = (mpt_world *)0x0;
        }
        else {
          local_70 = pmStack_48;
        }
        mpt_world_init((mpt_world *)name_local,local_70);
        wld_local._4_4_ = 0;
      }
    }
  }
  else {
    iVar1 = strcasecmp(name,"cyc");
    if ((iVar1 == 0) || (iVar1 = strcasecmp((char *)src_local,"cycles"), iVar1 == 0)) {
      if ((pmStack_28 == (mpt_convertable *)0x0) ||
         (local_74 = (*pmStack_28->_vptr->convert)(pmStack_28,0x75,name_local + 0x10), local_74 == 0
         )) {
        name_local[0x10] = '\0';
        name_local[0x11] = '\0';
        name_local[0x12] = '\0';
        name_local[0x13] = '\0';
        wld_local._4_4_ = 0;
      }
      else {
        if (-1 < local_74) {
          local_74 = 0;
        }
        wld_local._4_4_ = local_74;
      }
    }
    else {
      iVar1 = strcasecmp((char *)src_local,"color");
      if ((iVar1 == 0) || (iVar1 = strcasecmp((char *)src_local,"colour"), iVar1 == 0)) {
        if (pmStack_28 == (mpt_convertable *)0x0) {
          name_local[0x10] = '\0';
          name_local[0x11] = '\0';
          name_local[0x12] = '\0';
          name_local[0x13] = '\0';
          wld_local._4_4_ = 0;
        }
        else {
          wld_local._4_4_ = mpt_color_pset((mpt_color *)(name_local + 8),pmStack_28);
        }
      }
      else {
        iVar1 = strcasecmp((char *)src_local,"alias");
        if (iVar1 == 0) {
          if (pmStack_28 == (mpt_convertable *)0x0) {
            mpt_string_set((char **)name_local,(char *)0x0,0);
            wld_local._4_4_ = 0;
          }
          else {
            wld_local._4_4_ = mpt_string_pset((char **)name_local,pmStack_28);
          }
        }
        else {
          iVar1 = strcasecmp((char *)src_local,"width");
          if (iVar1 == 0) {
            if (pmStack_28 == (mpt_convertable *)0x0) {
              name_local[0xd] = '\x01';
              wld_local._4_4_ = 0;
            }
            else {
              wld_local._4_4_ = mpt_lattr_width((mpt_lineattr *)(name_local + 0xc),pmStack_28);
            }
          }
          else {
            iVar1 = strcasecmp((char *)src_local,"style");
            if (iVar1 == 0) {
              if (pmStack_28 == (mpt_convertable *)0x0) {
                name_local[0xc] = '\x01';
                wld_local._4_4_ = 0;
              }
              else {
                wld_local._4_4_ = mpt_lattr_style((mpt_lineattr *)(name_local + 0xc),pmStack_28);
              }
            }
            else {
              iVar1 = strcasecmp((char *)src_local,"sym");
              if ((iVar1 == 0) || (iVar1 = strcasecmp((char *)src_local,"symbol"), iVar1 == 0)) {
                if (pmStack_28 == (mpt_convertable *)0x0) {
                  name_local[0xe] = '\0';
                  wld_local._4_4_ = 0;
                }
                else {
                  wld_local._4_4_ = mpt_lattr_symbol((mpt_lineattr *)(name_local + 0xc),pmStack_28);
                }
              }
              else {
                iVar1 = strcasecmp((char *)src_local,"size");
                if (iVar1 == 0) {
                  if (pmStack_28 == (mpt_convertable *)0x0) {
                    name_local[0xf] = '\n';
                    wld_local._4_4_ = 0;
                  }
                  else {
                    wld_local._4_4_ = mpt_lattr_size((mpt_lineattr *)(name_local + 0xc),pmStack_28);
                  }
                }
                else {
                  wld_local._4_4_ = -1;
                }
              }
            }
          }
        }
      }
    }
  }
  return wld_local._4_4_;
}

Assistant:

extern int mpt_world_set(MPT_STRUCT(world) *wld, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	if (!name) {
		const MPT_STRUCT(world) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_world_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_world_fini(wld);
			mpt_world_init(wld, len ? from : 0);
			return 0;
		}
		if ((len = mpt_string_pset(&wld->_alias, src)) >= 0) {
			return len;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &wld->color)) >= 0) {
			if (!len) wld->color = def_world.color;
			return 0;
		}
		if ((type = mpt_lattr_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &wld->attr)) >= 0) {
			if (!len) wld->attr = def_world.attr;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(world) *from;
		int type;
		
		if (!src) {
			mpt_world_fini(wld);
			return 0;
		}
		if ((type = mpt_world_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_world_fini(wld);
			mpt_world_init(wld, len ? from : 0);
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcasecmp(name, "cyc") || !strcasecmp(name, "cycles")) {
		if (!src || !(len = src->_vptr->convert(src, 'u', &wld->cyc))) {
			wld->cyc = def_world.cyc;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "color") || !strcasecmp(name, "colour")) {
		if (!src) {
			wld->cyc = def_world.cyc;
			return 0;
		}
		return mpt_color_pset(&wld->color, src);
	}
	if (!strcasecmp(name, "alias")) {
		if (!src) {
			mpt_string_set(&wld->_alias, 0, 0);
			return 0;
		}
		return mpt_string_pset(&wld->_alias, src);
	}
	if (!strcasecmp(name, "width")) {
		if (!src) {
			wld->attr.width = def_world.attr.width;
			return 0;
		}
		return mpt_lattr_width(&wld->attr, src);
	}
	if (!strcasecmp(name, "style")) {
		if (!src) {
			wld->attr.style = def_world.attr.style;
			return 0;
		}
		return mpt_lattr_style(&wld->attr, src);
	}
	if (!strcasecmp(name, "sym") || !strcasecmp(name, "symbol")) {
		if (!src) {
			wld->attr.symbol = def_world.attr.symbol;
			return 0;
		}
		return mpt_lattr_symbol(&wld->attr, src);
	}
	if (!strcasecmp(name, "size")) {
		if (!src) {
			wld->attr.size = def_world.attr.size;
			return 0;
		}
		return mpt_lattr_size(&wld->attr, src);
	}
	return MPT_ERROR(BadArgument);
}